

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

void pnga_nbget_ghost_dir(Integer g_a,Integer *mask,Integer *nbhandle)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  C_Integer *pCVar6;
  global_array_t *pgVar7;
  Integer proc;
  Integer IVar8;
  int iVar9;
  C_Integer CVar10;
  size_t __n;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int _ndim;
  ulong uVar15;
  long lVar16;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer hi_rem [7];
  Integer lo_rem [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer subscript [7];
  Integer ld [7];
  int local_260;
  int local_248 [8];
  long local_228 [8];
  long local_1e8 [8];
  Integer local_1a8 [8];
  Integer local_168 [8];
  Integer local_128 [8];
  Integer local_e8 [7];
  long alStack_b0 [9];
  long local_68 [7];
  
  lVar1 = g_a + 1000;
  proc = pnga_nodeid();
  sVar2 = GA[lVar1].ndim;
  lVar11 = (long)sVar2;
  if (lVar11 < 1) {
    pnga_distribution(g_a,proc,local_e8,local_128);
  }
  else {
    lVar16 = 0;
    do {
      lVar14 = mask[lVar16];
      lVar13 = -lVar14;
      if (0 < lVar14) {
        lVar13 = lVar14;
      }
      if ((lVar14 != 0) && (lVar13 != 1)) {
        pnga_error("nga_nbget_ghost_dir: invalid mask entry",lVar14);
      }
      lVar16 = lVar16 + 1;
    } while (lVar11 != lVar16);
    pnga_distribution(g_a,proc,local_e8,local_128);
    if (0 < sVar2) {
      lVar16 = 0;
      do {
        lVar14 = GA[lVar1].dims[lVar16];
        lVar13 = GA[lVar1].width[lVar16];
        if (mask[lVar16] == -1) {
          lVar5 = local_e8[lVar16];
          if (lVar5 == 1) {
            local_168[lVar16] = (lVar14 - lVar13) + 1;
            local_1a8[lVar16] = lVar14;
          }
          else {
            local_168[lVar16] = lVar5 - lVar13;
            local_1a8[lVar16] = lVar5 + -1;
          }
        }
        else {
          if (mask[lVar16] == 1) {
            lVar5 = local_128[lVar16];
            if (lVar5 == lVar14) {
              local_168[lVar16] = 1;
            }
            else {
              local_168[lVar16] = lVar5 + 1;
              lVar13 = lVar13 + lVar5;
            }
          }
          else {
            local_168[lVar16] = local_e8[lVar16];
            lVar13 = local_128[lVar16];
          }
          local_1a8[lVar16] = lVar13;
        }
        lVar16 = lVar16 + 1;
      } while (lVar11 != lVar16);
      if (0 < sVar2) {
        lVar16 = 0;
        do {
          if (mask[lVar16] == -1) {
            alStack_b0[lVar16 + 1] = 0;
            lVar14 = GA[g_a + 1000].width[lVar16];
          }
          else if (mask[lVar16] == 1) {
            lVar14 = GA[g_a + 1000].width[lVar16];
            alStack_b0[lVar16 + 1] = (local_128[lVar16] - local_e8[lVar16]) + lVar14 + 1;
          }
          else {
            lVar14 = GA[g_a + 1000].width[lVar16];
            alStack_b0[lVar16 + 1] = lVar14;
          }
          local_68[lVar16] = (local_128[lVar16] - local_e8[lVar16]) + lVar14 * 2 + 1;
          lVar16 = lVar16 + 1;
        } while (lVar11 != lVar16);
      }
    }
  }
  pgVar7 = GA;
  uVar3 = GA[lVar1].ndim;
  uVar15 = (ulong)(short)uVar3;
  iVar9 = GA[lVar1].distr_type;
  local_260 = (int)proc;
  if (iVar9 - 1U < 3) {
    lVar11 = GA[lVar1].num_blocks[0];
    lVar16 = (long)local_260 % lVar11;
    local_248[0] = (int)lVar16;
    if (1 < (short)uVar3) {
      lVar14 = 0;
      IVar8 = proc;
      do {
        IVar8 = (long)((int)IVar8 - (int)lVar16) / lVar11;
        lVar11 = GA[g_a + 1000].num_blocks[lVar14 + 1];
        lVar16 = (long)(int)IVar8 % lVar11;
        local_248[lVar14 + 1] = (int)lVar16;
        lVar14 = lVar14 + 1;
      } while ((uVar15 & 0xffffffff) - 1 != lVar14);
    }
    if (0 < (short)uVar3) {
      lVar11 = 0;
      do {
        iVar9 = *(int *)((long)local_248 + lVar11);
        lVar16 = *(long *)((long)GA[g_a + 1000].block_dims + lVar11 * 2);
        *(long *)((long)local_1e8 + lVar11 * 2) = lVar16 * iVar9 + 1;
        lVar16 = ((long)iVar9 + 1) * lVar16;
        lVar14 = *(long *)((long)GA[g_a + 1000].dims + lVar11 * 2);
        if (lVar14 <= lVar16) {
          lVar16 = lVar14;
        }
        *(long *)((long)local_228 + lVar11 * 2) = lVar16;
        lVar11 = lVar11 + 4;
      } while ((uVar15 & 0xffffffff) << 2 != lVar11);
    }
    goto LAB_001a4dbe;
  }
  if (iVar9 == 4) {
    lVar11 = GA[lVar1].num_blocks[0];
    lVar16 = (long)local_260 % lVar11;
    local_248[0] = (int)lVar16;
    if (1 < (short)uVar3) {
      lVar14 = 0;
      IVar8 = proc;
      do {
        IVar8 = (long)((int)IVar8 - (int)lVar16) / lVar11;
        lVar11 = GA[g_a + 1000].num_blocks[lVar14 + 1];
        lVar16 = (long)(int)IVar8 % lVar11;
        local_248[lVar14 + 1] = (int)lVar16;
        lVar14 = lVar14 + 1;
      } while ((uVar15 & 0xffffffff) - 1 != lVar14);
    }
    if (0 < (short)uVar3) {
      pCVar6 = GA[lVar1].mapc;
      lVar11 = 0;
      iVar9 = 0;
      do {
        iVar4 = *(int *)((long)local_248 + lVar11);
        lVar14 = (long)iVar9 + (long)iVar4;
        *(C_Integer *)((long)local_1e8 + lVar11 * 2) = pCVar6[lVar14];
        lVar16 = *(long *)((long)GA[lVar1].num_blocks + lVar11 * 2);
        if ((long)iVar4 < lVar16 + -1) {
          lVar14 = pCVar6[lVar14 + 1] + -1;
        }
        else {
          lVar14 = *(long *)((long)GA[lVar1].dims + lVar11 * 2);
        }
        *(long *)((long)local_228 + lVar11 * 2) = lVar14;
        iVar9 = iVar9 + (int)lVar16;
        lVar11 = lVar11 + 4;
      } while ((uVar15 & 0xffffffff) << 2 != lVar11);
    }
    goto LAB_001a4dbe;
  }
  if (iVar9 != 0) goto LAB_001a4dbe;
  if (GA[lVar1].num_rstrctd == 0) {
    if ((short)uVar3 < 1) goto LAB_001a4dbe;
    lVar11 = 1;
    uVar12 = 0;
    do {
      lVar11 = lVar11 * GA[g_a + 1000].nblock[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
    if ((-1 < proc) && (proc < lVar11)) {
      if (0 < (short)uVar3) {
        pCVar6 = GA[lVar1].mapc;
        uVar12 = 0;
        lVar11 = 0;
        IVar8 = proc;
        do {
          lVar14 = (long)GA[g_a + 1000].nblock[uVar12];
          lVar16 = IVar8 % lVar14;
          local_1e8[uVar12] = pCVar6[lVar16 + lVar11];
          if (lVar16 == lVar14 + -1) {
            CVar10 = GA[g_a + 1000].dims[uVar12];
          }
          else {
            CVar10 = pCVar6[lVar16 + lVar11 + 1] + -1;
          }
          lVar11 = lVar11 + lVar14;
          local_228[uVar12] = CVar10;
          uVar12 = uVar12 + 1;
          IVar8 = IVar8 / lVar14;
        } while (uVar15 != uVar12);
      }
      goto LAB_001a4dbe;
    }
LAB_001a4d88:
    if ((short)uVar3 < 1) goto LAB_001a4dbe;
    __n = uVar15 * 8;
  }
  else {
    if (proc < GA[lVar1].num_rstrctd) {
      if ((short)uVar3 < 1) goto LAB_001a4dbe;
      lVar11 = 1;
      uVar12 = 0;
      do {
        lVar11 = lVar11 * GA[g_a + 1000].nblock[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
      if ((-1 < proc) && (proc < lVar11)) {
        if (0 < (short)uVar3) {
          pCVar6 = GA[lVar1].mapc;
          lVar11 = 0;
          uVar12 = 0;
          IVar8 = proc;
          do {
            lVar14 = (long)GA[g_a + 1000].nblock[uVar12];
            lVar16 = IVar8 % lVar14;
            local_1e8[uVar12] = pCVar6[lVar16 + lVar11];
            if (lVar16 == lVar14 + -1) {
              CVar10 = GA[g_a + 1000].dims[uVar12];
            }
            else {
              CVar10 = pCVar6[lVar16 + lVar11 + 1] + -1;
            }
            lVar11 = lVar11 + lVar14;
            local_228[uVar12] = CVar10;
            uVar12 = uVar12 + 1;
            IVar8 = IVar8 / lVar14;
          } while (uVar15 != uVar12);
        }
        goto LAB_001a4dbe;
      }
      goto LAB_001a4d88;
    }
    if ((short)uVar3 < 1) goto LAB_001a4dbe;
    __n = (ulong)uVar3 << 3;
  }
  memset(local_1e8,0,__n);
  memset(local_228,0xff,__n);
LAB_001a4dbe:
  if (uVar15 == 1) {
    local_68[0] = (local_228[0] - local_1e8[0]) + pgVar7[lVar1].width[0] * 2 + 1;
  }
  if ((short)uVar3 < 2) {
    lVar11 = 1;
    lVar16 = 0;
  }
  else {
    lVar11 = 1;
    lVar14 = 0;
    lVar16 = 0;
    do {
      lVar16 = lVar16 + alStack_b0[lVar14 + 1] * lVar11;
      lVar13 = (local_228[lVar14] - local_1e8[lVar14]) + pgVar7[g_a + 1000].width[lVar14] * 2 + 1;
      local_68[lVar14] = lVar13;
      lVar11 = lVar11 * lVar13;
      lVar14 = lVar14 + 1;
    } while (uVar15 - 1 != lVar14);
  }
  pnga_nbget(g_a,local_168,local_1a8,
             pgVar7[lVar1].ptr[proc] +
             (long)pgVar7[lVar1].elemsize * (lVar11 * alStack_b0[uVar15] + lVar16),local_68,nbhandle
            );
  return;
}

Assistant:

void pnga_nbget_ghost_dir(Integer g_a,
                               Integer *mask,
                               Integer *nbhandle)
{
  Integer handle = GA_OFFSET + g_a;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM], lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer subscript[MAXDIM], ld[MAXDIM];
  Integer i, ndim, dim, width;
  char *ptr_loc;
  Integer me = pnga_nodeid();
  /*Integer p_handle;*/
  ndim = GA[handle].ndim;
  /*p_handle = GA[handle].p_handle;*/
  /* check mask to see that it corresponds to a valid direction */
  for (i=0; i<ndim; i++) {
    if (labs(mask[i]) != 0 && labs(mask[i]) != 1)
      pnga_error("nga_nbget_ghost_dir: invalid mask entry", mask[i]);
  }

  /* get range of data on local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* locate data on remote processor */
  for (i=0; i<ndim; i++) {
    dim = (Integer)GA[handle].dims[i];
    width = (Integer)GA[handle].width[i];
    if (mask[i] == 1) {
      if (hi_loc[i] == dim) {
        lo_rem[i] = 1;
        hi_rem[i] = width;
      } else {
        lo_rem[i] = hi_loc[i]+1;
        hi_rem[i] = hi_loc[i]+width;
      }
    } else if (mask[i] == -1) {
      if (lo_loc[i] == 1) {
        lo_rem[i] = dim - width + 1;
        hi_rem[i] = dim;
      } else {
        lo_rem[i] = lo_loc[i] - width;
        hi_rem[i] = lo_loc[i] - 1;
      }
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }
  
  /* Get pointer to data destination on local block. Start by
     by finding subscript to origin of destination block */
  for (i=0; i<ndim; i++) {
    if (mask[i] == 1) {
      subscript[i] = hi_loc[i]-lo_loc[i]+1+GA[handle].width[i];
    } else if (mask[i] == -1) {
      subscript[i] = 0;
    } else {
      subscript[i] = GA[handle].width[i];
    }
    ld[i] = hi_loc[i]-lo_loc[i]+1+2*GA[handle].width[i];
  }
  gam_LocationWithGhosts(me, handle, subscript, &ptr_loc, ld);
  /* get data */
  pnga_nbget(g_a,lo_rem,hi_rem,ptr_loc,ld,nbhandle);  
}